

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O1

void __thiscall Triangle::Triangle(Triangle *this,mat4 *ltw,vec3 *v0,vec3 *v1,vec3 *v2,ColorRGB c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  ColorRGB::ColorRGB(&this->color);
  *(undefined8 *)((long)&(this->e0).field_0 + 4) = 0;
  *(undefined8 *)&(this->v1).field_0 = 0;
  *(undefined8 *)&(this->v0).field_0 = 0;
  *(undefined8 *)((long)&(this->v0).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->n).field_0 + 8) = 0;
  *(undefined8 *)((long)&(this->e1).field_0 + 4) = 0;
  *(undefined8 *)((long)&(this->e2).field_0 + 4) = 0;
  *(undefined8 *)&(this->n).field_0 = 0;
  *(undefined8 *)&(this->v2).field_0 = 0;
  *(undefined8 *)((long)&(this->v2).field_0 + 8) = 0;
  (this->v1).field_0.field_0.z = 0.0;
  fVar1 = (v0->field_0).field_0.x;
  fVar2 = (v0->field_0).field_0.y;
  fVar3 = (v0->field_0).field_0.z;
  fVar4 = ltw->value[1].field_0.field_0.y;
  fVar5 = ltw->value[0].field_0.field_0.y;
  fVar6 = ltw->value[2].field_0.field_0.y;
  fVar7 = ltw->value[3].field_0.field_0.y;
  fVar8 = ltw->value[1].field_0.field_0.z;
  fVar9 = ltw->value[0].field_0.field_0.z;
  fVar10 = ltw->value[2].field_0.field_0.z;
  fVar11 = ltw->value[3].field_0.field_0.z;
  (this->v0).field_0.field_0.x =
       ltw->value[2].field_0.field_0.x * fVar3 +
       ltw->value[0].field_0.field_0.x * fVar1 + ltw->value[1].field_0.field_0.x * fVar2 +
       ltw->value[3].field_0.field_0.x;
  (this->v0).field_0.field_0.y = fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + fVar7;
  (this->v0).field_0.field_0.z = fVar3 * fVar10 + fVar1 * fVar9 + fVar2 * fVar8 + fVar11;
  fVar1 = (v1->field_0).field_0.x;
  fVar2 = (v1->field_0).field_0.y;
  fVar3 = (v1->field_0).field_0.z;
  fVar4 = ltw->value[1].field_0.field_0.y;
  fVar5 = ltw->value[0].field_0.field_0.y;
  fVar6 = ltw->value[2].field_0.field_0.y;
  fVar7 = ltw->value[3].field_0.field_0.y;
  fVar8 = ltw->value[1].field_0.field_0.z;
  fVar9 = ltw->value[0].field_0.field_0.z;
  fVar10 = ltw->value[2].field_0.field_0.z;
  fVar11 = ltw->value[3].field_0.field_0.z;
  (this->v1).field_0.field_0.x =
       ltw->value[2].field_0.field_0.x * fVar3 +
       ltw->value[0].field_0.field_0.x * fVar1 + ltw->value[1].field_0.field_0.x * fVar2 +
       ltw->value[3].field_0.field_0.x;
  (this->v1).field_0.field_0.y = fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + fVar7;
  (this->v1).field_0.field_0.z = fVar3 * fVar10 + fVar1 * fVar9 + fVar2 * fVar8 + fVar11;
  fVar1 = (v2->field_0).field_0.x;
  fVar2 = (v2->field_0).field_0.y;
  fVar3 = (v2->field_0).field_0.z;
  fVar4 = ltw->value[1].field_0.field_0.y;
  fVar5 = ltw->value[0].field_0.field_0.y;
  fVar6 = ltw->value[2].field_0.field_0.y;
  fVar7 = ltw->value[3].field_0.field_0.y;
  fVar8 = ltw->value[1].field_0.field_0.z;
  fVar9 = ltw->value[0].field_0.field_0.z;
  fVar10 = ltw->value[2].field_0.field_0.z;
  fVar11 = ltw->value[3].field_0.field_0.z;
  (this->v2).field_0.field_0.x =
       ltw->value[2].field_0.field_0.x * fVar3 +
       ltw->value[0].field_0.field_0.x * fVar1 + ltw->value[1].field_0.field_0.x * fVar2 +
       ltw->value[3].field_0.field_0.x;
  (this->v2).field_0.field_0.y = fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + fVar7;
  (this->v2).field_0.field_0.z = fVar3 * fVar10 + fVar1 * fVar9 + fVar2 * fVar8 + fVar11;
  (this->color).r = (float)(int)c._0_8_;
  (this->color).g = (float)(int)((ulong)c._0_8_ >> 0x20);
  (this->color).b = c.b;
  _calculateNormal(this);
  _calculateEdges(this);
  return;
}

Assistant:

Triangle::Triangle(
    const glm::mat4 &ltw,
    glm::vec3 v0,
    glm::vec3 v1,
    glm::vec3 v2,
    ColorRGB c) {
    
    this->v0 = glm::vec3(ltw * glm::vec4(v0, 1));
    this->v1 = glm::vec3(ltw * glm::vec4(v1, 1));
    this->v2 = glm::vec3(ltw * glm::vec4(v2, 1));
    
    color = c;
    
//     std::cout << "v0: (" << this->v0.x << ", " << this->v0.y << ", " << this->v0.z << ") ";
//     std::cout << "v1: (" << this->v1.x << ", " << this->v1.y << ", " << this->v1.z << ") ";
//     std::cout << "v2: (" << this->v2.x << ", " << this->v2.y << ", " << this->v2.z << ") ";
  
    _calculateNormal();
    _calculateEdges();
}